

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_array.hpp
# Opt level: O1

void __thiscall
suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
::shift_buckets(suffix_array<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_unsigned_int,_false>
                *this,size_t dist,vector<unsigned_int,_std::allocator<unsigned_int>_> *param_2)

{
  uint *puVar1;
  size_type __new_size;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  datatype mxxindex_t;
  MPI_Request recv_reqs [2];
  datatype local_60;
  undefined1 local_48 [24];
  
  __new_size = this->local_size;
  if (__new_size !=
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    __assert_fail("local_size == local_B.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                  ,0x264,
                  "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                 );
  }
  uVar7 = (this->part).prefix;
  uVar12 = (ulong)uVar7;
  puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)puVar3 - (long)puVar2 >> 2 != __new_size) {
    if (puVar3 != puVar2) {
      (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    local_60._vptr_datatype = (_func_int **)((ulong)local_60._vptr_datatype & 0xffffffff00000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (param_2,__new_size,(value_type_conflict3 *)&local_60);
  }
  local_60._vptr_datatype = (_func_int **)&PTR__datatype_001a9f70;
  local_60.mpitype = (MPI_Datatype)&ompi_mpi_unsigned;
  local_60.builtin = true;
  uVar11 = uVar12 + dist;
  uVar9 = 0;
  if (uVar11 < this->n) {
    puVar1 = &(this->part).div1mod;
    if ((uint)uVar11 < *puVar1) {
      iVar6 = (int)((uVar11 & 0xffffffff) / (ulong)((this->part).div + 1));
    }
    else {
      iVar6 = ((uint)uVar11 - *puVar1) / (this->part).div + (this->part).mod;
    }
    uVar10 = iVar6 + 1;
    uVar4 = (this->part).mod;
    if (uVar10 < uVar4) {
      uVar4 = uVar10;
    }
    uVar11 = (uVar4 + (this->part).div * uVar10) - uVar11;
    uVar9 = 0;
    if (iVar6 != (this->comm).m_rank) {
      if (0x7ffffffe < uVar11) {
        __assert_fail("p1_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x27c,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start,uVar11 & 0xffffffff,&ompi_mpi_unsigned,iVar6,2,
                (this->comm).mpi_comm,local_48);
      uVar9 = 1;
    }
    uVar8 = this->local_size - uVar11;
    if ((uVar11 <= this->local_size && uVar8 != 0) && (iVar6 != this->p + -1)) {
      if (0x7ffffffe < uVar8) {
        __assert_fail("p2_recv_cnt < std::numeric_limits<int>::max()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x28a,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      MPI_Irecv((param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar11,uVar8,&ompi_mpi_unsigned,uVar10,2,
                (this->comm).mpi_comm,local_48 + uVar9 * 8);
      uVar9 = (ulong)((int)uVar9 + 1);
    }
  }
  if (dist <= (this->local_size + uVar12) - 1) {
    uVar11 = 0xffffffff;
    uVar8 = dist - uVar12;
    if (dist < uVar12 || uVar8 == 0) {
      uVar4 = uVar7 - (uint)dist;
      puVar1 = &(this->part).div1mod;
      if (uVar4 < *puVar1) {
        uVar11 = (ulong)uVar4 / (ulong)((this->part).div + 1);
      }
      else {
        uVar11 = (ulong)((uVar4 - *puVar1) / (this->part).div + (this->part).mod);
      }
    }
    uVar7 = (int)this->local_size + uVar7 + ~(uint)dist;
    puVar1 = &(this->part).div1mod;
    if (uVar7 < *puVar1) {
      uVar7 = uVar7 / ((this->part).div + 1);
    }
    else {
      uVar7 = (uVar7 - *puVar1) / (this->part).div + (this->part).mod;
    }
    uVar4 = (uint)uVar11;
    if (uVar4 == uVar7) {
      uVar8 = 0;
    }
    else if (-1 < (int)uVar4) {
      if (uVar4 == (this->comm).m_rank) {
        __assert_fail("p1 != comm.rank()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2a2,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar4 = uVar4 + 1;
      uVar10 = (this->part).mod;
      if (uVar4 < uVar10) {
        uVar10 = uVar4;
      }
      uVar8 = (dist - uVar12) + (ulong)(uVar4 * (this->part).div + uVar10);
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,uVar8 & 0xffffffff,&ompi_mpi_unsigned,uVar11
               ,2,(this->comm).mpi_comm);
    }
    if (uVar7 == (this->comm).m_rank) {
      if (uVar8 != dist) {
        __assert_fail("local_split == dist",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/suffix_array.hpp"
                      ,0x2b3,
                      "void suffix_array<__gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, unsigned int>::shift_buckets(std::size_t, std::vector<index_t> &) [InputIterator = __gnu_cxx::__normal_iterator<char *, std::basic_string<char>>, index_t = unsigned int, _CONSTRUCT_LCP = false]"
                     );
      }
      uVar12 = this->local_size;
      if (uVar8 < uVar12) {
        puVar2 = (param_2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar3 = (this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar5 = 0;
        do {
          puVar2[lVar5] = puVar3[uVar8 + lVar5];
          lVar5 = lVar5 + 1;
        } while (uVar12 - uVar8 != lVar5);
      }
    }
    else {
      MPI_Send((this->local_B).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + uVar8,(int)this->local_size - (int)uVar8,
               &ompi_mpi_unsigned,uVar7,2,(this->comm).mpi_comm);
    }
  }
  MPI_Waitall(uVar9,local_48,0);
  mxx::datatype::~datatype(&local_60);
  return;
}

Assistant:

void shift_buckets(std::size_t dist, std::vector<index_t>& local_B2) {
    // get # elements to the left
    std::size_t prev_size = part.excl_prefix_size();
    assert(local_size == local_B.size());

    // init B2
    if (local_B2.size() != local_size){
        local_B2.clear();
        local_B2.resize(local_size, 0);
    }

    mxx::datatype mxxindex_t = mxx::get_datatype<index_t>();
    MPI_Datatype mpi_index_t = mxxindex_t.type();

    MPI_Request recv_reqs[2];
    int n_irecvs = 0;
    // receive elements from the right
    if (prev_size + dist < n) {
        std::size_t right_first_gl_idx = prev_size + dist;
        int p1 = part.target_processor(right_first_gl_idx);

        std::size_t p1_gl_end = part.prefix_size(p1);
        std::size_t p1_recv_cnt = p1_gl_end - right_first_gl_idx;

        if (p1 != comm.rank()) {
            // only receive if the source is not myself (i.e., `rank`)
            // [otherwise results are directly written instead of MPI_Sended]
            assert(p1_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p1_recv_cnt;
            MPI_Irecv(&local_B2[0],recv_cnt, mpi_index_t, p1,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }

        if (p1_recv_cnt < local_size && p1 != p-1) {
            // also receive from one more processor
            int p2 = p1+1;
            // since p2 has at least local_size - 1 elements and at least
            // one element came from p1, we can assume that the receive count
            // is our local size minus the already received elements
            std::size_t p2_recv_cnt = local_size - p1_recv_cnt;

            assert(p2_recv_cnt < std::numeric_limits<int>::max());
            int recv_cnt = p2_recv_cnt;
            // send to `p1` (which is necessarily different from `rank`)
            MPI_Irecv(&local_B2[0] + p1_recv_cnt, recv_cnt, mpi_index_t, p2,
                      PSAC_TAG_SHIFT, comm, &recv_reqs[n_irecvs++]);
        }
    }

    // send elements to the left (split to at most 2 target processors)
    if (prev_size + local_size - 1 >= dist) {
        int p1 = -1;
        if (prev_size >= dist) {
            std::size_t first_gl_idx = prev_size - dist;
            p1 = part.target_processor(first_gl_idx);
        }
        std::size_t last_gl_idx = prev_size + local_size - 1 - dist;
        int p2 = part.target_processor(last_gl_idx);

        std::size_t local_split;
        if (p1 != p2) {
            // local start index of area for second processor
            if (p1 >= 0) {
                local_split = part.prefix_size(p1) + dist - prev_size;
                // send to first processor
                assert(p1 != comm.rank());
                MPI_Send(&local_B[0], local_split,
                         mpi_index_t, p1, PSAC_TAG_SHIFT, comm);
            } else {
                // p1 doesn't exist, then there is no prefix to add
                local_split = dist - prev_size;
            }
        } else {
            // only one target processor
            local_split = 0;
        }

        if (p2 != comm.rank()) {
            MPI_Send(&local_B[0] + local_split, local_size - local_split,
                     mpi_index_t, p2, PSAC_TAG_SHIFT, comm);
        } else {
            // in this case the split should be exactly at `dist`
            assert(local_split == dist);
            // locally reassign
            for (std::size_t i = local_split; i < local_size; ++i) {
                local_B2[i-local_split] = local_B[i];
            }
        }
    }

    // wait for successful receive:
    MPI_Waitall(n_irecvs, recv_reqs, MPI_STATUS_IGNORE);
}